

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O1

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:852:27)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  atomic<int> *paVar1;
  Lock *__mutex;
  basic_endpoint<asio::ip::udp> *e2;
  ostringstream *poVar2;
  NATHolePuncher *pNVar3;
  tonk *ptVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint8_t *ptr;
  pthread_mutex_t *__mutex_00;
  bool bVar7;
  int iVar8;
  OutputWorker *pOVar9;
  tonk *ptVar10;
  uint64_t value;
  type handler;
  ptr p;
  undefined1 local_2b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2a8;
  string local_298;
  address local_278;
  undefined1 local_258 [64];
  uint8_t *puStack_218;
  pthread_mutex_t *ppStack_210;
  tonk *local_208;
  ConnectionAddrMap *local_200;
  scheduler_operation *local_1f8;
  string local_1f0;
  ptr local_1d0;
  undefined1 local_1b8 [128];
  ios_base local_138 [272];
  
  local_258._0_8_ = base[1].next_;
  local_258._8_8_ = base[1].func_;
  local_1d0.h = (type *)local_258;
  local_258._16_8_ = *(undefined8 *)&base[1].task_result_;
  uVar5 = *(undefined8 *)((long)&base[2].next_ + 4);
  uVar6 = *(undefined8 *)((long)&base[2].func_ + 4);
  local_258._24_4_ = SUB84(base[2].next_,0);
  local_258._28_4_ = (undefined4)uVar5;
  local_258._32_4_ = (undefined4)((ulong)uVar5 >> 0x20);
  local_258._36_4_ = (undefined4)uVar6;
  local_258._40_4_ = (undefined4)((ulong)uVar6 >> 0x20);
  local_258._48_8_ = base[3].next_;
  local_258._56_8_ = base[3].func_;
  puStack_218 = *(uint8_t **)&base[3].task_result_;
  ppStack_210 = (pthread_mutex_t *)base[4].next_;
  local_208 = (tonk *)base[4].func_;
  local_200 = *(ConnectionAddrMap **)&base[4].task_result_;
  local_1f8 = base[5].next_;
  local_1d0.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:852:27)>
                 *)base;
  local_1d0.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:852:27)>
                 *)base;
  completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:852:27)>
  ::ptr::reset(&local_1d0);
  uVar5 = local_258._0_8_;
  if (owner == (void *)0x0) goto LAB_0013e9b7;
  pNVar3 = (((unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_> *)
            (local_258._0_8_ + 0xc7d8))->_M_t).
           super___uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>.
           _M_t.
           super__Tuple_impl<0UL,_tonk::NATHolePuncher_*,_std::default_delete<tonk::NATHolePuncher>_>
           .super__Head_base<0UL,_tonk::NATHolePuncher_*,_false>._M_head_impl;
  if (pNVar3 == (NATHolePuncher *)0x0) {
    if ((int)((Channel *)(local_258._0_8_ + 0x110))->ChannelMinLevel < 4) {
      local_1b8._0_8_ = ((Channel *)(local_258._0_8_ + 0x110))->ChannelName;
      poVar2 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,(((Channel *)(uVar5 + 0x110))->Prefix)._M_dataplus._M_p,
                 (((Channel *)(uVar5 + 0x110))->Prefix)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Ignoring P2P connect: P2P connection is not in progress",0x37);
      pOVar9 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_138);
    }
  }
  else {
    ptVar4 = (tonk *)(pNVar3->StartParams).EncryptionKey;
    ptVar10 = (tonk *)((ulong)ptVar4 >> 0x20 | (long)ptVar4 << 0x20);
    if ((pNVar3->StartParams).WinTies != false) {
      ptVar10 = ptVar4;
    }
    if (local_208 == ptVar10) {
      e2 = (basic_endpoint<asio::ip::udp> *)(local_258 + 0x10);
      if ((((pNVar3->SeenProbe)._M_base._M_i & 1U) == 0) ||
         ((((((unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_> *)
             (local_258._0_8_ + 0xc7d8))->_M_t).
            super___uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>.
            _M_t.
            super__Tuple_impl<0UL,_tonk::NATHolePuncher_*,_std::default_delete<tonk::NATHolePuncher>_>
            .super__Head_base<0UL,_tonk::NATHolePuncher_*,_false>._M_head_impl)->StartParams).
          WinTies != true)) {
        LOCK();
        (((((unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_> *)
           (local_258._0_8_ + 0xc7d8))->_M_t).
          super___uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>.
          _M_t.
          super__Tuple_impl<0UL,_tonk::NATHolePuncher_*,_std::default_delete<tonk::NATHolePuncher>_>
          .super__Head_base<0UL,_tonk::NATHolePuncher_*,_false>._M_head_impl)->SeenProbe)._M_base.
        _M_i = true;
        UNLOCK();
        __mutex = &((SessionOutgoing *)(local_258._0_8_ + 0x168))->PrivateLock;
        iVar8 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (iVar8 != 0) {
          std::__throw_system_error(iVar8);
        }
        local_1b8._0_8_ =
             *(undefined8 *)&(((SessionOutgoing *)(uVar5 + 0x168))->PeerUDPAddress).impl_.data_;
        uVar6 = *(undefined8 *)
                 ((long)&(((SessionOutgoing *)(uVar5 + 0x168))->PeerUDPAddress).impl_.data_ + 8);
        local_1b8._20_8_ =
             *(undefined8 *)
              ((long)&(((SessionOutgoing *)(uVar5 + 0x168))->PeerUDPAddress).impl_.data_ + 0x14);
        local_1b8._16_4_ =
             (undefined4)
             ((ulong)*(undefined8 *)
                      ((long)&(((SessionOutgoing *)(uVar5 + 0x168))->PeerUDPAddress).impl_.data_ +
                      0xc) >> 0x20);
        local_1b8._8_4_ = (undefined4)uVar6;
        local_1b8._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        bVar7 = asio::ip::operator==((basic_endpoint<asio::ip::udp> *)local_1b8,e2);
        if ((bVar7) && (local_200 == ((Dependencies *)(uVar5 + 0x70))->AddressMap)) {
          if (DAT_001e6880 < 2) {
            poVar2 = (ostringstream *)(local_1b8 + 0x10);
            local_1b8._0_8_ = tonk::ModuleLogger;
            local_1b8._8_4_ = Debug;
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,DAT_001e68b0,DAT_001e68b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,
                       "Repeated connection request from the same source address - No change needed"
                       ,0x4b);
            pOVar9 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_1b8);
            goto LAB_0013e90b;
          }
        }
        else {
          if (local_258._16_2_ == 2) {
            local_2b8._0_8_ = local_258._16_8_ & 0xffffffff00000000;
            local_2b8._8_8_ = 0;
            aStack_2a8._M_allocated_capacity = 0;
            aStack_2a8._8_8_ = 0;
          }
          else {
            local_2b8._8_8_ = CONCAT44(local_258._28_4_,local_258._24_4_);
            aStack_2a8._M_allocated_capacity = CONCAT44(local_258._36_4_,local_258._32_4_);
            aStack_2a8._8_8_ = ZEXT48((uint)local_258._40_4_);
            local_2b8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
          }
          asio::ip::address::to_string_abi_cxx11_(&local_298,(address *)local_2b8);
          if (DAT_001e6880 < 4) {
            swap_bytes(local_258._18_2_);
            poVar2 = (ostringstream *)(local_1b8 + 0x10);
            local_1b8._0_8_ = tonk::ModuleLogger;
            local_1b8._8_4_ = Warning;
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,DAT_001e68b0,DAT_001e68b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,"Switching NAT port pairs for tie-breaker. New dest: ",0x34
                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,local_298._M_dataplus._M_p,local_298._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,":",1);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
            pOVar9 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_1b8);
            std::__cxx11::ostringstream::~ostringstream(poVar2);
            std::ios_base::~ios_base(local_138);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p);
          }
          tonk::Connection::setPeerAddressAndSource
                    ((Connection *)uVar5,local_200,(IUDPSender *)local_1f8,e2);
        }
      }
      else if (DAT_001e6880 < 4) {
        poVar2 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = tonk::ModuleLogger;
        local_1b8._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,DAT_001e68b0,DAT_001e68b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,
                   "Ignoring connection request - We are tie breaker and received a probe already",
                   0x4d);
        pOVar9 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_1b8);
LAB_0013e90b:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
        std::ios_base::~ios_base(local_138);
      }
      tonk::SessionIncoming::ProcessDatagram
                ((SessionIncoming *)local_1b8,(uint64_t)(uVar5 + 0x6310),
                 (UDPAddress *)local_258._8_8_,(uint8_t *)e2,(uint)local_258._48_8_);
      if ((char *)local_1b8._0_8_ != (char *)0x0) {
        tonk::Connection::onDecodeFailure((Connection *)uVar5,(Result *)local_1b8);
      }
      __mutex_00 = ppStack_210;
      ptr = puStack_218;
      if (ppStack_210 != (pthread_mutex_t *)0x0) {
        iVar8 = pthread_mutex_lock(ppStack_210);
        if (iVar8 != 0) {
          std::__throw_system_error(iVar8);
        }
        pktalloc::Allocator::Free((Allocator *)&__mutex_00[1].__data,ptr);
        pthread_mutex_unlock(__mutex_00);
      }
      tonk::Result::~Result((Result *)local_1b8);
    }
    else {
      tonk::HexString_abi_cxx11_(&local_298,local_208,(uint64_t)ptVar10);
      pNVar3 = (((unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_> *)
                (uVar5 + 0xc7d8))->_M_t).
               super___uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>
               ._M_t.
               super__Tuple_impl<0UL,_tonk::NATHolePuncher_*,_std::default_delete<tonk::NATHolePuncher>_>
               .super__Head_base<0UL,_tonk::NATHolePuncher_*,_false>._M_head_impl;
      ptVar4 = (tonk *)(pNVar3->StartParams).EncryptionKey;
      ptVar10 = (tonk *)((ulong)ptVar4 >> 0x20 | (long)ptVar4 << 0x20);
      if ((pNVar3->StartParams).WinTies != false) {
        ptVar10 = ptVar4;
      }
      tonk::HexString_abi_cxx11_((string *)local_2b8,ptVar10,value);
      if (local_258._16_2_ == 2) {
        local_278._0_8_ = local_258._16_8_ & 0xffffffff00000000;
        local_278.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_278.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_278.ipv6_address_.scope_id_ = 0;
      }
      else {
        local_278.ipv6_address_.addr_.__in6_u._0_8_ = CONCAT44(local_258._28_4_,local_258._24_4_);
        local_278.ipv6_address_.addr_.__in6_u._8_8_ = CONCAT44(local_258._36_4_,local_258._32_4_);
        local_278.ipv6_address_.scope_id_ = (unsigned_long)(uint)local_258._40_4_;
        local_278.type_ = ipv6;
        local_278.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      }
      asio::ip::address::to_string_abi_cxx11_(&local_1f0,&local_278);
      if ((int)((Channel *)(uVar5 + 0x110))->ChannelMinLevel < 4) {
        swap_bytes(local_258._18_2_);
        local_1b8._0_8_ = ((Channel *)(uVar5 + 0x110))->ChannelName;
        poVar2 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,(((Channel *)(uVar5 + 0x110))->Prefix)._M_dataplus._M_p,
                   (((Channel *)(uVar5 + 0x110))->Prefix)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"Ignoring P2P connect: HandshakeKey=",0x23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,local_298._M_dataplus._M_p,local_298._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," IncomingKey=",0xd);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,(char *)local_2b8._0_8_,local_2b8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2," does not match from ",0x15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," : ",3);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        pOVar9 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar9,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base(local_138);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._0_8_ != &aStack_2a8) {
        operator_delete((void *)local_2b8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
    }
  }
  LOCK();
  paVar1 = &(((IConnection *)uVar5)->SelfRefCount).RefCount;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
LAB_0013e9b7:
  completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:852:27)>
  ::ptr::reset(&local_1d0);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }